

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

Cardinality __thiscall testing::Between(testing *this,int min,int max)

{
  int iVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  FailureReporterInterface *pFVar4;
  linked_ptr_internal extraout_RDX;
  Cardinality CVar5;
  stringstream ss;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR__CardinalityInterface_001db6b0;
  iVar1 = 0;
  if (0 < min) {
    iVar1 = min;
  }
  *(int *)(puVar2 + 1) = iVar1;
  if (iVar1 <= max) {
    iVar1 = max;
  }
  *(int *)((long)puVar2 + 0xc) = iVar1;
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (min < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation lower bound must be >= 0, ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"but is actually ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    std::__cxx11::stringbuf::str();
    pFVar4 = internal::GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])
              (pFVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock-gtest-all.cc"
               ,0x25da,local_1d0);
  }
  else if (max < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation upper bound must be >= 0, ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"but is actually ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
    std::__cxx11::stringbuf::str();
    pFVar4 = internal::GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])
              (pFVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock-gtest-all.cc"
               ,0x25de,local_1d0);
  }
  else {
    if (min <= max) goto LAB_001694be;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"The invocation upper bound (",0x1c);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,max);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,") must be >= the invocation lower bound (",0x29);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
    std::__cxx11::stringbuf::str();
    pFVar4 = internal::GetFailureReporter();
    (*pFVar4->_vptr_FailureReporterInterface[2])
              (pFVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock-gtest-all.cc"
               ,0x25e3,local_1d0);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
LAB_001694be:
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  *(undefined8 **)this = puVar2;
  *(testing **)(this + 8) = this + 8;
  CVar5.impl_.link_.next_ = extraout_RDX.next_;
  CVar5.impl_.value_ = (CardinalityInterface *)this;
  return (Cardinality)CVar5.impl_;
}

Assistant:

GTEST_API_ Cardinality Between(int min, int max) {
  return Cardinality(new BetweenCardinalityImpl(min, max));
}